

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

char * helicsTranslatorGetInfo(HelicsTranslator trans)

{
  string *psVar1;
  
  if ((trans == (HelicsTranslator)0x0) || (*(int *)((long)trans + 4) != -0x4c83cad2)) {
    psVar1 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar1 = helics::Interface::getInfo_abi_cxx11_(*(Interface **)((long)trans + 8));
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

static helics::TranslatorObject* getTranslatorObj(HelicsTranslator trans, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (trans == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidTranslatorString);
        return nullptr;
    }
    auto* tObj = reinterpret_cast<helics::TranslatorObject*>(trans);
    if (tObj->valid != translatorValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidTranslatorString);
        return nullptr;
    }
    return tObj;
}